

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

mbedtls_ct_condition_t
mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,mbedtls_mpi_uint *A,size_t A_limbs)

{
  ulong uVar1;
  mbedtls_ct_condition_t mVar2;
  mbedtls_ct_uint_t mVar3;
  ulong uVar4;
  size_t sVar5;
  
  mVar3 = mbedtls_ct_zero;
  if (1 < A_limbs) {
    sVar5 = 1;
    do {
      mVar3 = mVar3 | (long)(-((A[sVar5] ^ mbedtls_ct_zero) >> 1) | -(A[sVar5] ^ mbedtls_ct_zero))
                      >> 0x3f;
      sVar5 = sVar5 + 1;
    } while (A_limbs != sVar5);
  }
  uVar4 = mbedtls_ct_zero ^ min;
  uVar1 = (long)(-(mbedtls_ct_zero >> 1) |
                -((uVar4 ^ mbedtls_ct_zero ^ *A) >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f;
  mVar2 = 0xffffffffffffffff;
  if ((long)(-(mbedtls_ct_zero >> 1) |
            -((uVar1 & uVar4 | ~(mbedtls_ct_zero ^ uVar1) & (mbedtls_ct_zero ^ *A) - uVar4) >> 0x3f
             ^ mbedtls_ct_zero)) < 0) {
    mVar2 = mVar3;
  }
  return mVar2;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,
                                                    const mbedtls_mpi_uint *A,
                                                    size_t A_limbs)
{
    /* min <= least significant limb? */
    mbedtls_ct_condition_t min_le_lsl = mbedtls_ct_uint_ge(A[0], min);

    /* limbs other than the least significant one are all zero? */
    mbedtls_ct_condition_t msll_mask = MBEDTLS_CT_FALSE;
    for (size_t i = 1; i < A_limbs; i++) {
        msll_mask = mbedtls_ct_bool_or(msll_mask, mbedtls_ct_bool(A[i]));
    }

    /* min <= A iff the lowest limb of A is >= min or the other limbs
     * are not all zero. */
    return mbedtls_ct_bool_or(msll_mask, min_le_lsl);
}